

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

DynamicEntryList * __thiscall
cmELFInternalImpl<cmELFTypes64>::GetDynamicEntries
          (DynamicEntryList *__return_storage_ptr__,cmELFInternalImpl<cmELFTypes64> *this)

{
  pointer paVar1;
  bool bVar2;
  pointer __args;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = LoadDynamicSection(this);
  if (bVar2) {
    std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>::
    reserve(__return_storage_ptr__,
            (long)(this->DynamicSectionEntries).
                  super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->DynamicSectionEntries).
                  super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl.
                  super__Vector_impl_data._M_start >> 4);
    paVar1 = (this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__args = (this->DynamicSectionEntries).
                  super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl.
                  super__Vector_impl_data._M_start; __args != paVar1; __args = __args + 1) {
      std::vector<std::pair<long,unsigned_long>,std::allocator<std::pair<long,unsigned_long>>>::
      emplace_back<long&,unsigned_long&>
                ((vector<std::pair<long,unsigned_long>,std::allocator<std::pair<long,unsigned_long>>>
                  *)__return_storage_ptr__,&__args->d_tag,&(__args->d_un).d_val);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cmELF::DynamicEntryList cmELFInternalImpl<Types>::GetDynamicEntries()
{
  cmELF::DynamicEntryList result;

  // Ensure entries have been read from file
  if (!this->LoadDynamicSection()) {
    return result;
  }

  // Copy into public array
  result.reserve(this->DynamicSectionEntries.size());
  for (ELF_Dyn& dyn : this->DynamicSectionEntries) {
    result.emplace_back(dyn.d_tag, dyn.d_un.d_val);
  }

  return result;
}